

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcBm.c
# Opt level: O0

int checkListConsistency
              (Vec_Int_t **iMatch1,Vec_Int_t **oMatch1,Vec_Int_t **iMatch2,Vec_Int_t **oMatch2,
              int iLastItem1,int oLastItem1,int iLastItem2,int oLastItem2)

{
  int oLastItem1_local;
  int iLastItem1_local;
  Vec_Int_t **oMatch2_local;
  Vec_Int_t **iMatch2_local;
  Vec_Int_t **oMatch1_local;
  Vec_Int_t **iMatch1_local;
  
  if ((iLastItem1 == iLastItem2) && (oLastItem1 == oLastItem2)) {
    iMatch1_local._4_4_ = 1;
  }
  else {
    iMatch1_local._4_4_ = 0;
  }
  return iMatch1_local._4_4_;
}

Assistant:

int checkListConsistency(Vec_Int_t ** iMatch1, Vec_Int_t ** oMatch1, Vec_Int_t ** iMatch2, Vec_Int_t ** oMatch2, int iLastItem1, int oLastItem1, int iLastItem2, int oLastItem2)
{
    //int i;

    if(iLastItem1 != iLastItem2 || oLastItem1 != oLastItem2)
        return FALSE;

    /*for(i = 0; i < iLastItem1; i++) {
        if(Vec_IntSize(iMatch1[i]) != Vec_IntSize(iMatch2[i]))
            return FALSE;
    }

    for(i = 0; i < oLastItem1; i++) {
        if(Vec_IntSize(oMatch1[i]) != Vec_IntSize(oMatch2[i]))
            return FALSE;
    }*/
        
    return TRUE;
}